

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::constant_op_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstantOp *cop)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t id;
  uint32_t *puVar2;
  uint *puVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  BaseType BVar8;
  SPIRType *pSVar9;
  long *plVar10;
  ulong uVar11;
  SPIRType *pSVar12;
  runtime_error *prVar13;
  char *pcVar14;
  size_type *psVar15;
  ulong uVar16;
  uint32_t uVar17;
  _Alloc_hider _Var18;
  char (*in_R9) [2];
  bool bVar19;
  undefined4 uStack_218;
  BaseType input_type;
  string *local_210;
  string local_208;
  string cast_op1;
  string right_arg;
  string op;
  string left_arg;
  uint *local_160;
  uint local_148 [8];
  bool *local_128;
  size_t local_120;
  bool local_110 [24];
  TypedID<(spirv_cross::Types)1> *local_f8;
  size_t local_f0;
  TypedID<(spirv_cross::Types)1> local_e0 [8];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  pSVar9 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      (cop->basetype).id);
  op._M_dataplus._M_p = (pointer)&op.field_2;
  op._M_string_length = 0;
  op.field_2._M_local_buf[0] = '\0';
  uVar7 = 0x81;
  if ((this->options).es != false) {
    uVar7 = 299;
  }
  iVar6 = *(int *)&(cop->super_IVariant).field_0xc;
  if (((this->options).version <= uVar7) &&
     (((iVar6 - 0x6dU < 0x40 && ((0x8000040012000019U >> ((ulong)(iVar6 - 0x6dU) & 0x3f) & 1) != 0))
      || ((iVar6 - 0xaeU < 0x15 && ((0x100015U >> (iVar6 - 0xaeU & 0x1f) & 1) != 0)))))) {
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&left_arg,"Unsigned integers are not supported on legacy targets.","");
    ::std::runtime_error::runtime_error(prVar13,(string *)&left_arg);
    *(undefined ***)prVar13 = &PTR__runtime_error_003d4e98;
    __cxa_throw(prVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_210 = __return_storage_ptr__;
  if (iVar6 < 0x7e) {
    if (0x70 < iVar6) {
      if (2 < iVar6 - 0x71U) goto switchD_001e6dd8_caseD_7f;
      type_to_glsl_constructor_abi_cxx11_(&left_arg,this,pSVar9);
      ::std::__cxx11::string::operator=((string *)&op,(string *)&left_arg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)left_arg._M_dataplus._M_p != &left_arg.field_2) {
        operator_delete(left_arg._M_dataplus._M_p);
      }
      goto LAB_001e78b5;
    }
    if (iVar6 != 0x4f) {
      if (iVar6 != 0x51) {
        if (iVar6 == 0x52) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&left_arg,"OpCompositeInsert spec constant op is not supported.","");
          ::std::runtime_error::runtime_error(prVar13,(string *)&left_arg);
          *(undefined ***)prVar13 = &PTR__runtime_error_003d4e98;
          __cxa_throw(prVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        goto switchD_001e6dd8_caseD_7f;
      }
      puVar2 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
      access_chain_internal_abi_cxx11_
                (__return_storage_ptr__,this,*puVar2,puVar2 + 1,
                 (int)(cop->arguments).super_VectorView<unsigned_int>.buffer_size - 1,1,
                 (AccessChainMeta *)0x0);
      goto LAB_001e784f;
    }
    type_to_glsl_constructor_abi_cxx11_(__return_storage_ptr__,this,pSVar9);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pSVar9 = Compiler::expression_type
                       (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr);
    uVar7 = pSVar9->vecsize;
    to_enclosed_expression_abi_cxx11_
              (&left_arg,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    to_enclosed_expression_abi_cxx11_
              (&right_arg,this,(cop->arguments).super_VectorView<unsigned_int>.ptr[1],true);
    if (2 < (uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size) {
      paVar1 = &cast_op1.field_2;
      uVar16 = 2;
      do {
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        if ((cop->arguments).super_VectorView<unsigned_int>.ptr[uVar16] < uVar7) {
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,left_arg._M_dataplus._M_p,
                     left_arg._M_dataplus._M_p +
                     CONCAT44(left_arg._M_string_length._4_4_,(undefined4)left_arg._M_string_length)
                    );
          ::std::__cxx11::string::append((char *)&local_208);
          plVar10 = (long *)::std::__cxx11::string::_M_replace_aux
                                      ((ulong)&local_208,local_208._M_string_length,0,'\x01');
          psVar15 = (size_type *)(plVar10 + 2);
          if ((size_type *)*plVar10 == psVar15) {
            cast_op1.field_2._M_allocated_capacity = *psVar15;
            cast_op1.field_2._8_8_ = plVar10[3];
            cast_op1._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            cast_op1.field_2._M_allocated_capacity = *psVar15;
            cast_op1._M_dataplus._M_p = (pointer)*plVar10;
          }
          cast_op1._M_string_length = plVar10[1];
          *plVar10 = (long)psVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_210,(ulong)cast_op1._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cast_op1._M_dataplus._M_p != paVar1) {
            operator_delete(cast_op1._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
LAB_001e7144:
            operator_delete(local_208._M_dataplus._M_p);
          }
        }
        else {
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,right_arg._M_dataplus._M_p,
                     right_arg._M_dataplus._M_p + right_arg._M_string_length);
          ::std::__cxx11::string::append((char *)&local_208);
          plVar10 = (long *)::std::__cxx11::string::_M_replace_aux
                                      ((ulong)&local_208,local_208._M_string_length,0,'\x01');
          psVar15 = (size_type *)(plVar10 + 2);
          if ((size_type *)*plVar10 == psVar15) {
            cast_op1.field_2._M_allocated_capacity = *psVar15;
            cast_op1.field_2._8_8_ = plVar10[3];
            cast_op1._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            cast_op1.field_2._M_allocated_capacity = *psVar15;
            cast_op1._M_dataplus._M_p = (pointer)*plVar10;
          }
          cast_op1._M_string_length = plVar10[1];
          *plVar10 = (long)psVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_210,(ulong)cast_op1._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cast_op1._M_dataplus._M_p != paVar1) {
            operator_delete(cast_op1._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) goto LAB_001e7144;
        }
        uVar16 = uVar16 + 1;
        uVar11 = (ulong)(uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size;
        if (uVar16 < uVar11) {
          ::std::__cxx11::string::append((char *)local_210);
          uVar11 = (ulong)(uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size;
        }
      } while (uVar16 < uVar11);
    }
    __return_storage_ptr__ = local_210;
    ::std::__cxx11::string::append((char *)local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)right_arg._M_dataplus._M_p != &right_arg.field_2) {
      operator_delete(right_arg._M_dataplus._M_p);
    }
    _Var18._M_p = left_arg._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)left_arg._M_dataplus._M_p == &left_arg.field_2) goto LAB_001e784f;
    goto LAB_001e784a;
  }
  switch(iVar6) {
  case 0x7e:
    pcVar14 = "-";
    goto LAB_001e78de;
  default:
switchD_001e6dd8_caseD_7f:
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&left_arg,"Unimplemented spec constant op.","");
    ::std::runtime_error::runtime_error(prVar13,(string *)&left_arg);
    *(undefined ***)prVar13 = &PTR__runtime_error_003d4e98;
    __cxa_throw(prVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 0x80:
    pcVar14 = "+";
    break;
  case 0x82:
    pcVar14 = "-";
    break;
  case 0x84:
    pcVar14 = "*";
    break;
  case 0x86:
  case 0x87:
    pcVar14 = "/";
    break;
  case 0x89:
  case 0x8b:
    pcVar14 = "%";
    break;
  case 0x8a:
    puVar2 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    uVar17 = *puVar2;
    id = puVar2[1];
    to_enclosed_expression_abi_cxx11_(&left_arg,this,uVar17,true);
    to_enclosed_expression_abi_cxx11_(&right_arg,this,id,true);
    to_enclosed_expression_abi_cxx11_(&cast_op1,this,uVar17,true);
    to_enclosed_expression_abi_cxx11_(&local_208,this,id,true);
    join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&left_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x349f71,
               (char (*) [4])&right_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35c335,
               (char (*) [4])0x35c56f,(char (*) [2])&cast_op1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34a3be,
               (char (*) [4])&local_208,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,
               (char (*) [2])CONCAT44(input_type,uStack_218));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cast_op1._M_dataplus._M_p != &cast_op1.field_2) {
      operator_delete(cast_op1._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)right_arg._M_dataplus._M_p != &right_arg.field_2) {
      operator_delete(right_arg._M_dataplus._M_p);
    }
    _Var18._M_p = left_arg._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)left_arg._M_dataplus._M_p == &left_arg.field_2) goto LAB_001e784f;
    goto LAB_001e784a;
  case 0xa4:
  case 0xaa:
    pcVar14 = "==";
    break;
  case 0xa5:
  case 0xab:
    pcVar14 = "!=";
    break;
  case 0xa6:
    pcVar14 = "||";
    break;
  case 0xa7:
    pcVar14 = "&&";
    break;
  case 0xa8:
    pcVar14 = "!";
    goto LAB_001e78de;
  case 0xa9:
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size < 3) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.","");
      ::std::runtime_error::runtime_error(prVar13,(string *)&left_arg);
      *(undefined ***)prVar13 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    puVar3 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    in_R9 = (char (*) [2])(ulong)*puVar3;
    bVar5 = to_trivial_mix_op(this,pSVar9,&op,puVar3[2],puVar3[1],*puVar3);
    if (!bVar5) {
      puVar2 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
      to_ternary_expression_abi_cxx11_
                (__return_storage_ptr__,this,pSVar9,*puVar2,puVar2[1],puVar2[2]);
      goto LAB_001e784f;
    }
LAB_001e78b5:
    iVar6 = *(int *)&(cop->super_IVariant).field_0xc;
    bVar5 = false;
    bVar4 = false;
    uVar17 = 0;
    bVar19 = false;
    if (iVar6 - 0x71U < 2) goto LAB_001e731d;
    goto LAB_001e7332;
  case 0xac:
  case 0xad:
    pcVar14 = ">";
    break;
  case 0xae:
  case 0xaf:
    pcVar14 = ">=";
    break;
  case 0xb0:
  case 0xb1:
    pcVar14 = "<";
    break;
  case 0xb2:
  case 0xb3:
    pcVar14 = "<=";
    break;
  case 0xc2:
  case 0xc3:
    pcVar14 = ">>";
    break;
  case 0xc4:
    pcVar14 = "<<";
    break;
  case 0xc5:
    pcVar14 = "|";
    break;
  case 0xc6:
    pcVar14 = "^";
    break;
  case 199:
    pcVar14 = "&";
    break;
  case 200:
    pcVar14 = "~";
LAB_001e78de:
    bVar5 = false;
    ::std::__cxx11::string::_M_replace((ulong)&op,0,(char *)0x0,(ulong)pcVar14);
    bVar19 = true;
    goto LAB_001e731d;
  }
  ::std::__cxx11::string::_M_replace((ulong)&op,0,(char *)0x0,(ulong)pcVar14);
  bVar5 = true;
  bVar19 = false;
LAB_001e731d:
  bVar4 = bVar19;
  pSVar12 = Compiler::expression_type
                      (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr);
  uVar17 = pSVar12->width;
  iVar6 = *(int *)&(cop->super_IVariant).field_0xc;
LAB_001e7332:
  bVar19 = true;
  if (((0x2b < iVar6 - 0x80U) || ((0xc0000000015U >> ((ulong)(iVar6 - 0x80U) & 0x3f) & 1) == 0)) &&
     (3 < iVar6 - 0xc4U)) {
    bVar19 = false;
  }
  if (iVar6 < 0xaa) {
    if (iVar6 < 0x86) {
      if (iVar6 == 0x71) {
switchD_001e73bd_caseD_86:
        BVar8 = to_unsigned_basetype(uVar17);
        goto LAB_001e73e0;
      }
      if ((iVar6 == 0x72) || (iVar6 == 0x7e)) goto switchD_001e73bd_caseD_87;
    }
    else {
      switch(iVar6) {
      case 0x86:
      case 0x89:
        goto switchD_001e73bd_caseD_86;
      case 0x87:
      case 0x8b:
switchD_001e73bd_caseD_87:
        BVar8 = to_signed_basetype(uVar17);
        goto LAB_001e73e0;
      }
    }
switchD_001e73bd_caseD_88:
    BVar8 = *(BaseType *)&(pSVar9->super_IVariant).field_0xc;
  }
  else {
    uVar7 = iVar6 - 0xaa;
    if (0x19 < uVar7) goto switchD_001e73bd_caseD_88;
    if ((0x1000154U >> (uVar7 & 0x1f) & 1) != 0) goto switchD_001e73bd_caseD_86;
    if ((0x20002a8U >> (uVar7 & 0x1f) & 1) != 0) goto switchD_001e73bd_caseD_87;
    if ((3U >> (uVar7 & 0x1f) & 1) == 0) goto switchD_001e73bd_caseD_88;
    BVar8 = to_signed_basetype(uVar17);
  }
LAB_001e73e0:
  __return_storage_ptr__ = local_210;
  input_type = BVar8;
  if (bVar5) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size < 2) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.","");
      ::std::runtime_error::runtime_error(prVar13,(string *)&left_arg);
      *(undefined ***)prVar13 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    right_arg._M_string_length = 0;
    right_arg.field_2._M_local_buf[0] = '\0';
    cast_op1._M_string_length = 0;
    cast_op1.field_2._M_allocated_capacity =
         cast_op1.field_2._M_allocated_capacity & 0xffffffffffffff00;
    puVar2 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    cast_op1._M_dataplus._M_p = (pointer)&cast_op1.field_2;
    right_arg._M_dataplus._M_p = (pointer)&right_arg.field_2;
    binary_op_bitcast_helper
              ((SPIRType *)&left_arg,this,&right_arg,&cast_op1,&input_type,*puVar2,puVar2[1],bVar19)
    ;
    __return_storage_ptr__ = local_210;
    BVar8 = *(BaseType *)&(pSVar9->super_IVariant).field_0xc;
    if (BVar8 == Boolean || BVar8 == input_type) {
      join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (local_210,(spirv_cross *)0x35c56f,(char (*) [2])&right_arg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x345c37,
                 (char (*) [2])&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x345c37,
                 (char (*) [2])&cast_op1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,
                 (char (*) [2])CONCAT44(input_type,uStack_218));
    }
    else {
      left_arg._M_string_length._4_4_ = input_type;
      (*(this->super_Compiler)._vptr_Compiler[0x38])(local_210,this,pSVar9);
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_208,(spirv_cross *)&right_arg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x345c37,
                 (char (*) [2])&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x345c37,
                 (char (*) [2])&cast_op1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(input_type,uStack_218));
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_208._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    left_arg._M_dataplus._M_p = (pointer)&PTR__SPIRType_003d5290;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    local_f0 = 0;
    if (local_f8 != local_e0) {
      free(local_f8);
    }
    local_120 = 0;
    if (local_128 != local_110) {
      free(local_128);
    }
    if (local_160 != local_148) {
      free(local_160);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cast_op1._M_dataplus._M_p != &cast_op1.field_2) {
      operator_delete(cast_op1._M_dataplus._M_p);
    }
    _Var18._M_p = right_arg._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)right_arg._M_dataplus._M_p == &right_arg.field_2) goto LAB_001e784f;
  }
  else if (bVar4) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.","");
      ::std::runtime_error::runtime_error(prVar13,(string *)&left_arg);
      *(undefined ***)prVar13 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    bitcast_glsl_abi_cxx11_
              (&left_arg,this,pSVar9,*(cop->arguments).super_VectorView<unsigned_int>.ptr);
    join<char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)0x35c56f,(char (*) [2])&op,&left_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,in_R9);
    _Var18 = left_arg._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)left_arg._M_dataplus._M_p == &left_arg.field_2) goto LAB_001e784f;
  }
  else if (*(int *)&(cop->super_IVariant).field_0xc - 0x71U < 2) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.","");
      ::std::runtime_error::runtime_error(prVar13,(string *)&left_arg);
      *(undefined ***)prVar13 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pSVar12 = Compiler::expression_type
                        (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr)
    ;
    if ((pSVar12->width < pSVar9->width) &&
       (BVar8 != *(BaseType *)&(pSVar12->super_IVariant).field_0xc)) {
      SPIRType::SPIRType((SPIRType *)&left_arg,pSVar12);
      left_arg._M_string_length._4_4_ = BVar8;
      bitcast_glsl_abi_cxx11_
                (&right_arg,this,(SPIRType *)&left_arg,
                 *(cop->arguments).super_VectorView<unsigned_int>.ptr);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35c56f,
                 (char (*) [2])&right_arg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,in_R9
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)right_arg._M_dataplus._M_p != &right_arg.field_2) {
        operator_delete(right_arg._M_dataplus._M_p);
      }
      left_arg._M_dataplus._M_p = (pointer)&PTR__SPIRType_003d5290;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      local_b8 = 0;
      if (local_c0 != local_a8) {
        free(local_c0);
      }
      local_f0 = 0;
      if (local_f8 != local_e0) {
        free(local_f8);
      }
      local_120 = 0;
      if (local_128 != local_110) {
        free(local_128);
      }
      if (local_160 != local_148) {
        free(local_160);
      }
      goto LAB_001e784f;
    }
    to_expression_abi_cxx11_
              (&left_arg,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35c56f,
               (char (*) [2])&left_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,in_R9);
    _Var18 = left_arg._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)left_arg._M_dataplus._M_p == &left_arg.field_2) goto LAB_001e784f;
  }
  else {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.","");
      ::std::runtime_error::runtime_error(prVar13,(string *)&left_arg);
      *(undefined ***)prVar13 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    to_expression_abi_cxx11_
              (&left_arg,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35c56f,
               (char (*) [2])&left_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,in_R9);
    _Var18 = left_arg._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)left_arg._M_dataplus._M_p == &left_arg.field_2) goto LAB_001e784f;
  }
LAB_001e784a:
  operator_delete(_Var18._M_p);
LAB_001e784f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)op._M_dataplus._M_p != &op.field_2) {
    operator_delete(op._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_op_expression(const SPIRConstantOp &cop)
{
	auto &type = get<SPIRType>(cop.basetype);
	bool binary = false;
	bool unary = false;
	string op;

	if (is_legacy() && is_unsigned_opcode(cop.opcode))
		SPIRV_CROSS_THROW("Unsigned integers are not supported on legacy targets.");

	// TODO: Find a clean way to reuse emit_instruction.
	switch (cop.opcode)
	{
	case OpSConvert:
	case OpUConvert:
	case OpFConvert:
		op = type_to_glsl_constructor(type);
		break;

#define GLSL_BOP(opname, x) \
	case Op##opname:        \
		binary = true;      \
		op = x;             \
		break

#define GLSL_UOP(opname, x) \
	case Op##opname:        \
		unary = true;       \
		op = x;             \
		break

		GLSL_UOP(SNegate, "-");
		GLSL_UOP(Not, "~");
		GLSL_BOP(IAdd, "+");
		GLSL_BOP(ISub, "-");
		GLSL_BOP(IMul, "*");
		GLSL_BOP(SDiv, "/");
		GLSL_BOP(UDiv, "/");
		GLSL_BOP(UMod, "%");
		GLSL_BOP(SMod, "%");
		GLSL_BOP(ShiftRightLogical, ">>");
		GLSL_BOP(ShiftRightArithmetic, ">>");
		GLSL_BOP(ShiftLeftLogical, "<<");
		GLSL_BOP(BitwiseOr, "|");
		GLSL_BOP(BitwiseXor, "^");
		GLSL_BOP(BitwiseAnd, "&");
		GLSL_BOP(LogicalOr, "||");
		GLSL_BOP(LogicalAnd, "&&");
		GLSL_UOP(LogicalNot, "!");
		GLSL_BOP(LogicalEqual, "==");
		GLSL_BOP(LogicalNotEqual, "!=");
		GLSL_BOP(IEqual, "==");
		GLSL_BOP(INotEqual, "!=");
		GLSL_BOP(ULessThan, "<");
		GLSL_BOP(SLessThan, "<");
		GLSL_BOP(ULessThanEqual, "<=");
		GLSL_BOP(SLessThanEqual, "<=");
		GLSL_BOP(UGreaterThan, ">");
		GLSL_BOP(SGreaterThan, ">");
		GLSL_BOP(UGreaterThanEqual, ">=");
		GLSL_BOP(SGreaterThanEqual, ">=");

	case OpSRem:
	{
		uint32_t op0 = cop.arguments[0];
		uint32_t op1 = cop.arguments[1];
		return join(to_enclosed_expression(op0), " - ", to_enclosed_expression(op1), " * ", "(",
		                 to_enclosed_expression(op0), " / ", to_enclosed_expression(op1), ")");
	}

	case OpSelect:
	{
		if (cop.arguments.size() < 3)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// This one is pretty annoying. It's triggered from
		// uint(bool), int(bool) from spec constants.
		// In order to preserve its compile-time constness in Vulkan GLSL,
		// we need to reduce the OpSelect expression back to this simplified model.
		// If we cannot, fail.
		if (to_trivial_mix_op(type, op, cop.arguments[2], cop.arguments[1], cop.arguments[0]))
		{
			// Implement as a simple cast down below.
		}
		else
		{
			// Implement a ternary and pray the compiler understands it :)
			return to_ternary_expression(type, cop.arguments[0], cop.arguments[1], cop.arguments[2]);
		}
		break;
	}

	case OpVectorShuffle:
	{
		string expr = type_to_glsl_constructor(type);
		expr += "(";

		uint32_t left_components = expression_type(cop.arguments[0]).vecsize;
		string left_arg = to_enclosed_expression(cop.arguments[0]);
		string right_arg = to_enclosed_expression(cop.arguments[1]);

		for (uint32_t i = 2; i < uint32_t(cop.arguments.size()); i++)
		{
			uint32_t index = cop.arguments[i];
			if (index >= left_components)
				expr += right_arg + "." + "xyzw"[index - left_components];
			else
				expr += left_arg + "." + "xyzw"[index];

			if (i + 1 < uint32_t(cop.arguments.size()))
				expr += ", ";
		}

		expr += ")";
		return expr;
	}

	case OpCompositeExtract:
	{
		auto expr = access_chain_internal(cop.arguments[0], &cop.arguments[1], uint32_t(cop.arguments.size() - 1),
		                                  ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, nullptr);
		return expr;
	}

	case OpCompositeInsert:
		SPIRV_CROSS_THROW("OpCompositeInsert spec constant op is not supported.");

	default:
		// Some opcodes are unimplemented here, these are currently not possible to test from glslang.
		SPIRV_CROSS_THROW("Unimplemented spec constant op.");
	}

	uint32_t bit_width = 0;
	if (unary || binary || cop.opcode == OpSConvert || cop.opcode == OpUConvert)
		bit_width = expression_type(cop.arguments[0]).width;

	SPIRType::BaseType input_type;
	bool skip_cast_if_equal_type = opcode_is_sign_invariant(cop.opcode);

	switch (cop.opcode)
	{
	case OpIEqual:
	case OpINotEqual:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpSMod:
	case OpSDiv:
	case OpShiftRightArithmetic:
	case OpSConvert:
	case OpSNegate:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
	case OpUMod:
	case OpUDiv:
	case OpShiftRightLogical:
	case OpUConvert:
		input_type = to_unsigned_basetype(bit_width);
		break;

	default:
		input_type = type.basetype;
		break;
	}

#undef GLSL_BOP
#undef GLSL_UOP
	if (binary)
	{
		if (cop.arguments.size() < 2)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		string cast_op0;
		string cast_op1;
		auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, cop.arguments[0],
		                                              cop.arguments[1], skip_cast_if_equal_type);

		if (type.basetype != input_type && type.basetype != SPIRType::Boolean)
		{
			expected_type.basetype = input_type;
			auto expr = bitcast_glsl_op(type, expected_type);
			expr += '(';
			expr += join(cast_op0, " ", op, " ", cast_op1);
			expr += ')';
			return expr;
		}
		else
			return join("(", cast_op0, " ", op, " ", cast_op1, ")");
	}
	else if (unary)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// Auto-bitcast to result type as needed.
		// Works around various casting scenarios in glslang as there is no OpBitcast for specialization constants.
		return join("(", op, bitcast_glsl(type, cop.arguments[0]), ")");
	}
	else if (cop.opcode == OpSConvert || cop.opcode == OpUConvert)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		auto &arg_type = expression_type(cop.arguments[0]);
		if (arg_type.width < type.width && input_type != arg_type.basetype)
		{
			auto expected = arg_type;
			expected.basetype = input_type;
			return join(op, "(", bitcast_glsl(expected, cop.arguments[0]), ")");
		}
		else
			return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
	else
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");
		return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
}